

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O3

void Abc_SclMarkSkippedCells(SC_Lib *p)

{
  uint uVar1;
  FILE *__stream;
  char *pcVar2;
  uint *puVar3;
  uint uVar4;
  char Buffer [1000];
  char FileName [1000];
  char local_808 [1008];
  char local_418 [1000];
  
  uVar4 = 0;
  sprintf(local_418,"%s.skip",p->pName);
  __stream = fopen(local_418,"rb");
  if (__stream != (FILE *)0x0) {
    pcVar2 = fgets(local_808,999,__stream);
    if (pcVar2 != (char *)0x0) {
      uVar4 = 0;
      do {
        while (pcVar2 = strtok(local_808,"\r\n\t "), pcVar2 == (char *)0x0) {
LAB_004718a9:
          pcVar2 = fgets(local_808,999,__stream);
          if (pcVar2 == (char *)0x0) goto LAB_004718fd;
        }
        puVar3 = (uint *)Abc_SclHashLookup(p,pcVar2);
        if (puVar3 == (uint *)0x0) {
LAB_00471899:
          printf("Cannot find cell \"%s\" in the library \"%s\".\n",pcVar2,p->pName);
          goto LAB_004718a9;
        }
        uVar1 = *puVar3;
        if ((ulong)uVar1 == 0xffffffff) goto LAB_00471899;
        if (((int)uVar1 < 0) || ((p->vCells).nSize <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        *(undefined4 *)((long)(p->vCells).pArray[uVar1] + 0xc) = 1;
        uVar4 = uVar4 + 1;
        pcVar2 = fgets(local_808,999,__stream);
      } while (pcVar2 != (char *)0x0);
    }
LAB_004718fd:
    fclose(__stream);
    printf("Marked %d cells for skipping in the library \"%s\".\n",(ulong)uVar4,p->pName);
  }
  return;
}

Assistant:

void Abc_SclMarkSkippedCells( SC_Lib * p )
{
    char FileName[1000];
    char Buffer[1000], * pName;
    SC_Cell * pCell;
    FILE * pFile;
    int CellId, nSkipped = 0;
    sprintf( FileName, "%s.skip", p->pName );
    pFile = fopen( FileName, "rb" );
    if ( pFile == NULL )
        return;
    while ( fgets( Buffer, 999, pFile ) != NULL )
    {
        pName = strtok( Buffer, "\r\n\t " );
        if ( pName == NULL )
            continue;
        CellId = Abc_SclCellFind( p, pName );
        if ( CellId == -1 )
        {
            printf( "Cannot find cell \"%s\" in the library \"%s\".\n", pName, p->pName );
            continue;
        }
        pCell = SC_LibCell( p, CellId );
        pCell->fSkip = 1;
        nSkipped++;
    }
    fclose( pFile );
    printf( "Marked %d cells for skipping in the library \"%s\".\n", nSkipped, p->pName );
}